

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

void on_xio_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  IO_OPEN_RESULT open_result_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_xio_open_complete",0x343,1,"Context on_xio_open_complete is NULL");
    }
  }
  else if (open_result == IO_OPEN_OK) {
    if (*(long *)((long)context + 8) != 0) {
      (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x10),1);
    }
    *(undefined4 *)((long)context + 0x4c) = 2;
    *(undefined4 *)((long)context + 0xb8) = 1;
  }
  else if (*(long *)((long)context + 8) != 0) {
    (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x10),2);
  }
  return;
}

Assistant:

static void on_xio_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    /* Codes_SRS_UHTTP_07_049: [ If not NULL uhttp_client_open shall call the on_connect callback with the callback_ctx, once the underlying xio's open is complete. ] */
    if (context != NULL)
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)context;
        if (open_result == IO_OPEN_OK)
        {
            /* Codes_SRS_UHTTP_07_042: [ If the underlying socket opens successfully the on_connect callback shall be call with HTTP_CALLBACK_REASON_OK... ] */
            if (http_data->on_connect != NULL)
            {
                http_data->on_connect(http_data->connect_user_ctx, HTTP_CALLBACK_REASON_OK);
            }
            http_data->recv_msg.recv_state = state_open;
            http_data->connected = 1;
        }
        else
        {
            /* Codes_SRS_UHTTP_07_043: [ Otherwise on_connect callback shall be call with HTTP_CLIENT_OPEN_REQUEST_FAILED. ] */
            if (http_data->on_connect != NULL)
            {
                http_data->on_connect(http_data->connect_user_ctx, HTTP_CALLBACK_REASON_OPEN_FAILED);
            }
        }
    }
    else
    {
        LogError("Context on_xio_open_complete is NULL");
    }
}